

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.h
# Opt level: O0

bool __thiscall re2c::Spec::add_def(Spec *this,RuleOp *r)

{
  bool bVar1;
  _Self local_38;
  key_type local_2c;
  _Self local_28;
  RuleOp *local_20;
  RuleOp *r_local;
  Spec *this_local;
  
  local_20 = r;
  r_local = (RuleOp *)this;
  local_2c.value = (uint32_t)rule_rank_t::def();
  local_28._M_node =
       (_Base_ptr)
       std::
       map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
       ::find(&this->rules,&local_2c);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
       ::end(&this->rules);
  bVar1 = std::operator!=(&local_28,&local_38);
  if (!bVar1) {
    add(this,local_20);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool add_def (RuleOp * r)
	{
		if (rules.find (rule_rank_t::def ()) != rules.end ())
		{
			return false;
		}
		else
		{
			add (r);
			return true;
		}
	}